

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O0

void MapOptHandler_fs_nocheckposition(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  FName local_24;
  FFsOptions *local_20;
  FFsOptions *opt;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  opt = (FFsOptions *)info;
  info_local = (level_info_t *)parse;
  FName::FName(&local_24,"fragglescript");
  local_20 = level_info_t::GetOptData<FFsOptions>(info,&local_24,true);
  bVar1 = FMapInfoParser::CheckAssign((FMapInfoParser *)info_local);
  if (bVar1) {
    FScanner::MustGetNumber((FScanner *)info_local);
    (local_20->super_FOptionalMapinfoData).field_0x14 = *(int *)&(info_local->NextMap).Chars != 0;
  }
  else {
    (local_20->super_FOptionalMapinfoData).field_0x14 = 1;
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(fs_nocheckposition, false)
{
	FFsOptions *opt = info->GetOptData<FFsOptions>("fragglescript");

	if (parse.CheckAssign())
	{
		parse.sc.MustGetNumber();
		opt->nocheckposition = !!parse.sc.Number;
	}
	else
	{
		opt->nocheckposition = true;
	}
}